

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.cpp
# Opt level: O0

int64_t getLastPCR(File *file,int bufferSize,int64_t fileSize)

{
  byte bVar1;
  uint8_t *buffer;
  ssize_t sVar2;
  uint8_t *end;
  size_t __nbytes;
  int64_t local_70;
  uint8_t startcode;
  PESPacket *pesPacket;
  int64_t lastPcrVal;
  uint8_t *bufEnd;
  uint8_t *curPtr;
  int len;
  uint8_t *tmpBuffer;
  int64_t fileSize_local;
  int bufferSize_local;
  File *file_local;
  
  __nbytes = fileSize - bufferSize;
  if ((long)__nbytes < 0) {
    local_70 = 0;
  }
  else {
    __nbytes = (size_t)bufferSize;
    local_70 = fileSize - __nbytes;
  }
  File::seek(file,local_70,smBegin);
  buffer = (uint8_t *)operator_new__((long)bufferSize);
  sVar2 = File::read(file,(int)buffer,(void *)(ulong)(uint)bufferSize,__nbytes);
  if ((int)sVar2 < 1) {
    file_local = (File *)0xfffffffffffffffe;
  }
  else {
    end = buffer + (int)sVar2;
    pesPacket = (PESPacket *)0xffffffffffffffff;
    for (bufEnd = MPEGHeader::findNextMarker(buffer,end); bufEnd <= end + -0x11;
        bufEnd = MPEGHeader::findNextMarker(bufEnd + 4,end)) {
      bVar1 = bufEnd[3];
      if (((((0xbf < bVar1) && (bVar1 < 0xf0)) || (bVar1 == 0xbd)) ||
          ((bVar1 == 0xfd || (bVar1 == 0xbf)))) && ((bufEnd[7] & 0x80) == 0x80)) {
        pesPacket = (PESPacket *)PESPacket::getPts((PESPacket *)bufEnd);
      }
    }
    if (buffer != (uint8_t *)0x0) {
      operator_delete__(buffer);
    }
    file_local = (File *)pesPacket;
  }
  return (int64_t)file_local;
}

Assistant:

int64_t getLastPCR(const File& file, const int bufferSize, const int64_t fileSize)
{
    file.seek(FFMAX(0, fileSize - bufferSize), File::SeekMethod::smBegin);
    const auto tmpBuffer = new uint8_t[bufferSize];
    const int len = file.read(tmpBuffer, bufferSize);
    if (len < 1)
        return -2;
    uint8_t* curPtr = tmpBuffer;
    uint8_t* bufEnd = tmpBuffer + len;
    int64_t lastPcrVal = -1;

    curPtr = MPEGHeader::findNextMarker(curPtr, bufEnd);
    while (curPtr <= bufEnd - 9 - 8)
    {
        const auto pesPacket = reinterpret_cast<PESPacket*>(curPtr);
        const uint8_t startcode = curPtr[3];
        if ((startcode >= 0xc0 && startcode <= 0xef) || (startcode == PES_PRIVATE_DATA1) || (startcode == PES_VC1_ID) ||
            (startcode == PES_PRIVATE_DATA2))
        {
            if ((pesPacket->flagsLo & 0x80) == 0x80)
                lastPcrVal = pesPacket->getPts();
        }
        curPtr = MPEGHeader::findNextMarker(curPtr + 4, bufEnd);
    }
    delete[] tmpBuffer;
    return lastPcrVal;
}